

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test2.cpp
# Opt level: O1

int main(void)

{
  uint uVar1;
  long lVar2;
  void *__s;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  result_type __x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sparse;
  uint32_t row;
  uniform_int_distribution<unsigned_int> dis_row;
  mt19937_64 gen;
  random_device rd;
  uint local_1ddc;
  undefined1 local_1dd8 [16];
  uint *local_1dc8;
  result_type_conflict local_1dbc;
  ulong local_1db8;
  param_type local_1db0;
  normal_distribution<double> local_1da8;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_1d80;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  uVar1 = std::random_device::_M_getval();
  local_1d80._M_x[0] = (unsigned_long)uVar1;
  lVar2 = 1;
  uVar3 = local_1d80._M_x[0];
  do {
    uVar3 = (uVar3 >> 0x3e ^ uVar3) * 0x5851f42d4c957f2d + lVar2;
    local_1d80._M_x[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x138);
  local_1d80._M_p = 0x138;
  local_1da8._M_param._M_mean = 40.96;
  local_1da8._M_param._M_stddev = 8.192;
  local_1db0._M_a = 0;
  local_1db0._M_b = 0xfff;
  local_1da8._M_saved = 0.0;
  local_1da8._M_saved_available = false;
  local_1dc8 = (uint *)0x0;
  local_1dd8 = ZEXT816(0) << 0x20;
  local_1ddc = 0;
  do {
    __x = std::normal_distribution<double>::operator()(&local_1da8,&local_1d80,&local_1da8._M_param)
    ;
    uVar3 = lrint(__x);
    if ((int)uVar3 != 0) {
      uVar5 = (long)(local_1dd8._8_8_ - local_1dd8._0_8_) >> 2;
      local_1db8 = uVar3 & 0xffffffff;
      uVar3 = 0;
      do {
LAB_001023eb:
        if ((long)(local_1dd8._8_8_ - local_1dd8._0_8_) >> 2 == (uint)((int)uVar3 * 2) + uVar5) {
          local_1dbc = std::uniform_int_distribution<unsigned_int>::operator()
                                 ((uniform_int_distribution<unsigned_int> *)&local_1db0,&local_1d80,
                                  &local_1db0);
          for (uVar4 = uVar5; uVar4 < (ulong)((long)(local_1dd8._8_8_ - local_1dd8._0_8_) >> 2);
              uVar4 = uVar4 + 2) {
            if (*(result_type_conflict *)(local_1dd8._0_8_ + uVar4 * 4) == local_1dbc)
            goto LAB_001023eb;
          }
          if ((uint *)local_1dd8._8_8_ == local_1dc8) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_1dd8,
                       (iterator)local_1dd8._8_8_,&local_1dbc);
          }
          else {
            *(result_type_conflict *)local_1dd8._8_8_ = local_1dbc;
            local_1dd8._8_8_ = (uint *)(local_1dd8._8_8_ + 4);
          }
          if ((uint *)local_1dd8._8_8_ == local_1dc8) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_1dd8,
                       (iterator)local_1dd8._8_8_,&local_1ddc);
          }
          else {
            *(uint *)local_1dd8._8_8_ = local_1ddc;
            local_1dd8._8_8_ = (uint *)(local_1dd8._8_8_ + 4);
          }
          goto LAB_001023eb;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != local_1db8);
    }
    local_1ddc = local_1ddc + 1;
    if (0x103f < local_1ddc) {
      __s = operator_new(0x8200);
      memset(__s,0,0x8200);
      blanczos(local_1dd8._0_8_,(ulong)((long)(local_1dd8._8_8_ - local_1dd8._0_8_) >> 2) >> 1,
               0x1000,0x1040,__s);
      operator_delete(__s,0x8200);
      if ((void *)local_1dd8._0_8_ != (void *)0x0) {
        operator_delete((void *)local_1dd8._0_8_,(long)local_1dc8 - local_1dd8._0_8_);
      }
      std::random_device::_M_fini();
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
    constexpr double   dens  = 0.01;
    constexpr uint32_t Nrow  = 1U << 12U;
    constexpr uint32_t Ncol  = Nrow + 64U;

    std::random_device rd;
    std::mt19937_64 gen(rd());
    std::uniform_int_distribution<uint32_t> dis_row(0U, Nrow - 1U);
    std::normal_distribution<double> dis_normal(dens * Nrow, 0.2 * dens * Nrow);

    std::vector<uint32_t> sparse;
    for (uint32_t col = 0U; col < Ncol; ++col)
    {
        const uint32_t Nsamples = lrint(dis_normal(gen));
        const uint64_t Nbefore  = sparse.size();
        for (uint32_t elem = 0U; elem < Nsamples; ++elem)
        {
            while (sparse.size() == Nbefore + 2U * elem)
            {
                const uint32_t row = dis_row(gen);
                bool exists = false;
                for (uint64_t old = Nbefore; old < sparse.size(); old += 2U)
                    if (sparse[old] == row)
                    {
                        exists = true;
                        break;
                    }
                if (!exists)
                {
                    sparse.push_back(row);
                    sparse.push_back(col);
                }
            }
        }
    }

    std::vector<uint64_t> result = std::vector<uint64_t>(Ncol, 0U);
    /*uint32_t Nsol =*/ blanczos(&sparse[0U], sparse.size() >> 1U, Nrow, Ncol, &result[0U]);
    
    return 0;
}